

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O3

double crnlib::image_utils::compute_ssim(image_u8 *a,image_u8 *b,int channel_index)

{
  uint uVar1;
  uint uVar2;
  color_quad<unsigned_char,_int> *pcVar3;
  color_quad<unsigned_char,_int> *pcVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint8 uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  uint ix;
  long lVar20;
  long lVar21;
  long lVar22;
  double dVar23;
  double dVar24;
  uint8 sx [36];
  uint8 sy [36];
  uint8 local_88 [48];
  uint8 local_58 [40];
  
  uVar7 = a->m_height;
  if (uVar7 != 0) {
    uVar6 = a->m_width;
    dVar24 = 0.0;
    uVar14 = 0;
    uVar12 = 0;
    do {
      if (uVar6 == 0) {
        uVar6 = 0;
      }
      else {
        uVar7 = 0;
        do {
          uVar1 = a->m_pitch;
          iVar8 = a->m_height - 1;
          pcVar3 = a->m_pPixels;
          iVar16 = b->m_width - 1;
          iVar13 = b->m_height - 1;
          pcVar4 = b->m_pPixels;
          uVar2 = b->m_pitch;
          lVar22 = 0;
          lVar15 = 0;
          do {
            iVar10 = uVar14 + (int)lVar15;
            iVar5 = iVar8;
            if (iVar10 < iVar8) {
              iVar5 = iVar10;
            }
            iVar17 = iVar13;
            if (iVar10 < iVar13) {
              iVar17 = iVar10;
            }
            if (iVar10 < 0) {
              iVar17 = 0;
              iVar5 = 0;
            }
            iVar17 = iVar17 * uVar2;
            lVar20 = 0;
            lVar21 = lVar22;
            do {
              iVar11 = uVar7 + (int)lVar20;
              iVar10 = uVar6 - 1;
              if (iVar11 < (int)(uVar6 - 1)) {
                iVar10 = iVar11;
              }
              if (iVar11 < 0) {
                iVar10 = 0;
              }
              uVar18 = iVar10 + iVar5 * uVar1;
              if (channel_index < 0) {
                iVar10 = iVar11;
                if (iVar16 <= iVar11) {
                  iVar10 = iVar16;
                }
                lVar19 = lVar15 * 6 + lVar20;
                if (iVar11 < 0) {
                  iVar10 = 0;
                }
                local_88[lVar21] =
                     (uint8)((uint)pcVar3[uVar18].field_0.field_0.b * 0x1d2f + 0x8000 +
                             (uint)pcVar3[uVar18].field_0.field_0.g * 0x9646 +
                             (uint)pcVar3[uVar18].field_0.field_0.r * 0x4c8b >> 0x10);
                uVar18 = iVar10 + iVar17;
                uVar9 = (uint8)((uint)pcVar4[uVar18].field_0.field_0.b * 0x1d2f + 0x8000 +
                                (uint)pcVar4[uVar18].field_0.field_0.g * 0x9646 +
                                (uint)pcVar4[uVar18].field_0.field_0.r * 0x4c8b >> 0x10);
              }
              else {
                iVar10 = iVar11;
                if (iVar16 <= iVar11) {
                  iVar10 = iVar16;
                }
                if (iVar11 < 0) {
                  iVar10 = 0;
                }
                local_88[lVar21] = pcVar3[uVar18].field_0.c[(uint)channel_index];
                uVar9 = pcVar4[(uint)(iVar10 + iVar17)].field_0.c[(uint)channel_index];
                lVar19 = lVar21;
              }
              local_58[lVar19] = uVar9;
              lVar20 = lVar20 + 1;
              lVar21 = lVar21 + 1;
            } while (lVar20 != 6);
            lVar15 = lVar15 + 1;
            lVar22 = lVar22 + 6;
          } while (lVar15 != 6);
          dVar23 = compute_block_ssim(0x24,local_88,local_58);
          dVar24 = dVar24 + dVar23;
          uVar12 = uVar12 + 1;
          uVar7 = uVar7 + 6;
          uVar6 = a->m_width;
        } while (uVar7 < uVar6);
        uVar7 = a->m_height;
      }
      uVar14 = uVar14 + 6;
    } while (uVar14 < uVar7);
    if (uVar12 != 0) {
      return dVar24 / (double)uVar12;
    }
  }
  return 0.0;
}

Assistant:

double compute_ssim(const image_u8& a, const image_u8& b, int channel_index)
        {
            const uint N = 6;
            uint8 sx[N * N], sy[N * N];

            double total_ssim = 0.0f;
            uint total_blocks = 0;

            //image_u8 yimg((a.get_width() + N - 1) / N, (a.get_height() + N - 1) / N);

            for (uint y = 0; y < a.get_height(); y += N)
            {
                for (uint x = 0; x < a.get_width(); x += N)
                {
                    for (uint iy = 0; iy < N; iy++)
                    {
                        for (uint ix = 0; ix < N; ix++)
                        {
                            if (channel_index < 0)
                            {
                                sx[ix + iy * N] = (uint8)a.get_clamped(x + ix, y + iy).get_luma();
                            }
                            else
                            {
                                sx[ix + iy * N] = (uint8)a.get_clamped(x + ix, y + iy)[channel_index];
                            }

                            if (channel_index < 0)
                            {
                                sy[ix + iy * N] = (uint8)b.get_clamped(x + ix, y + iy).get_luma();
                            }
                            else
                            {
                                sy[ix + iy * N] = (uint8)b.get_clamped(x + ix, y + iy)[channel_index];
                            }
                        }
                    }

                    double ssim = compute_block_ssim(N * N, sx, sy);
                    total_ssim += ssim;
                    total_blocks++;

                    //uint ssim_c = (uint)math::clamp<double>(ssim * 127.0f + 128.0f, 0, 255);
                    //yimg(x / N, y / N).set(ssim_c, ssim_c, ssim_c, 255);
                }
            }

            if (!total_blocks)
            {
                return 0.0f;
            }

            //save_to_file_stb_or_miniz("ssim.tga", yimg, cWriteFlagGrayscale);

            return total_ssim / total_blocks;
        }